

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_sprite.cpp
# Opt level: O3

void __thiscall GLSprite::Draw(GLSprite *this,int pass)

{
  secplane_t *psVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar2;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar3;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar4;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar5;
  BYTE BVar6;
  ushort uVar7;
  FRenderStyle style;
  PalEntry PVar8;
  lightlist_t *plVar9;
  long lVar10;
  long lVar11;
  FFlatVertexBuffer *pFVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [13];
  int iVar16;
  FColormap FVar17;
  bool bVar18;
  bool bVar19;
  uint uVar20;
  TArray<lightlist_t,_lightlist_t> *pTVar21;
  int rellight;
  uint uVar22;
  ulong uVar23;
  particle_t *particle;
  AActor *pAVar24;
  secplane_t *top;
  secplane_t *bottom;
  long lVar25;
  bool isadditive;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  FColormap thiscm;
  FQuadDrawer qd;
  secplane_t topp;
  secplane_t bottomp;
  float local_e8;
  undefined1 local_d8 [4];
  undefined1 auStack_d4 [4];
  undefined8 uStack_d0;
  double local_c8;
  undefined8 local_c0;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_b8;
  undefined8 local_b4;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_ac;
  FColormap *local_a8;
  FQuadDrawer local_a0;
  ulong local_90;
  secplane_t local_88;
  secplane_t local_58;
  
  if ((pass & 0xfffffffdU) == 1) {
    return;
  }
  rellight = gl_weaponlight.Value * extralight;
  isadditive = false;
  if (this->fullbright != false) {
    rellight = 0;
  }
  if (pass == 4) {
    if ((this->RenderStyle).field_0.BlendOp != '\x01') {
      gl_RenderState.mBrightmapEnabled = false;
    }
    style = this->RenderStyle;
    if (((this->trans <= 0.9999999) ||
        ((this->actor != (AActor *)0x0 & this->fullbright &
         (gl_fixedcolormap == 0 && gl_usecolorblending.Value)) != 1)) ||
       (this->gltexture == (FMaterial *)0x0)) {
      bVar18 = false;
    }
    else {
      bVar18 = FMaterial::GetTransparent(this->gltexture);
      bVar18 = !bVar18;
    }
    isadditive = false;
    gl_SetRenderStyle(style,false,bVar18);
    local_e8 = gl_mask_sprite_threshold.Value + -0.001;
    gl_RenderState.mAlphaThreshold = -0.001;
    if (this->hw_styleflags != '\x02') {
      gl_RenderState.mAlphaThreshold = local_e8;
    }
    BVar6 = (this->RenderStyle).field_0.BlendOp;
    if (BVar6 == '\x01') {
      isadditive = (this->RenderStyle).field_0.DestAlpha == '\x01';
    }
    else if (BVar6 == '\b') {
      uVar20 = (this->Colormap).FadeColor.field_0.d;
      if ((uVar20 & 0xff) == 0 && (uVar20 >> 8 & 0xff) + (uVar20 >> 0x10 & 0xff) == 0) {
        gl_RenderState.mColor.vec[3] = 0.44;
      }
      else {
        fVar26 = (float)ViewPos.X - this->x;
        fVar28 = (float)ViewPos.Y - this->y;
        if (uVar20 < 0x1000000) {
          uVar22 = 0xff - this->lightlevel;
          if (0xfe < (int)uVar22) {
            uVar22 = 0xff;
          }
          uVar20 = 0x3c;
          if (0x3c < (int)uVar22) {
            uVar20 = uVar22;
          }
          (this->Colormap).FadeColor.field_0.field_0.a = (BYTE)uVar20;
          local_e8 = gl_mask_sprite_threshold.Value + -0.001;
        }
        else {
          uVar20 = uVar20 >> 0x18;
        }
        fVar26 = expf(SQRT(fVar28 * fVar28 + fVar26 * fVar26) * 1.6e-05 * (float)(int)-uVar20);
        gl_RenderState.mColor.vec[3] = fVar26 * 0.44 + 0.022;
      }
      gl_RenderState.mDesaturation = (this->Colormap).desaturation;
      gl_RenderState.mColor.vec[0] = 0.2;
      gl_RenderState.mColor.vec[1] = 0.2;
      gl_RenderState.mColor.vec[2] = 0.2;
      isadditive = true;
      gl_RenderState.mAlphaThreshold = local_e8;
    }
  }
  if ((this->RenderStyle).field_0.BlendOp != '\b') {
    if (((gl_lights.Value == true) && (GLRenderer->mLightCount != 0)) &&
       ((gl_fixedcolormap == 0 && (this->fullbright == false)))) {
      particle = (particle_t *)0x0;
      pAVar24 = (AActor *)0x0;
      if (gl_light_sprites.Value != false) {
        pAVar24 = this->actor;
      }
      if (gl_light_particles.Value != false) {
        particle = this->particle;
      }
      gl_SetDynSpriteLight(pAVar24,particle);
    }
    gl_SetColor(this->lightlevel,rellight,&this->Colormap,this->trans,false);
  }
  gl_RenderState.mObjectColor.field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&(this->ThingColor).field_0.field_0;
  uVar20 = (this->Colormap).FadeColor.field_0.d;
  if ((uVar20 & 0xff) == 0 && (uVar20 >> 8 & 0xff) + (uVar20 >> 0x10 & 0xff) == 0) {
    this->foglevel = (BYTE)this->lightlevel;
  }
  if (((this->RenderStyle).field_0.Flags & 0x40) != 0) {
    (this->Colormap).FadeColor.field_0.d = 0;
    isadditive = true;
    uVar20 = 0;
  }
  local_a8 = &this->Colormap;
  if (((this->RenderStyle).field_0.BlendOp & 0xfe) == 2) {
    if (this->modelframe == (FSpriteModelFrame *)0x0) {
      if ((uVar20 & 0xff) != 0 || (uVar20 >> 8 & 0xff) + (uVar20 >> 0x10 & 0xff) != 0) {
        gl_RenderState.mAlphaThreshold = 0.0;
        gl_RenderState.mFogEnabled = false;
        gl_RenderState.mFogColor.field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
        gl_RenderState.mLightParms[2] = -0.0;
        bVar18 = true;
        goto LAB_0046d4f0;
      }
    }
    else {
      (this->RenderStyle).field_0.BlendOp = '\x04';
    }
  }
  gl_SetFog((uint)this->foglevel,rellight,local_a8,isadditive);
  bVar18 = false;
LAB_0046d4f0:
  if (this->gltexture == (FMaterial *)0x0) {
    if (this->modelframe == (FSpriteModelFrame *)0x0) {
      gl_RenderState.mTextureEnabled = false;
    }
  }
  else {
    FRenderState::SetMaterial
              (&gl_RenderState,this->gltexture,3,this->translation,this->OverrideShader,
               (bool)(((this->RenderStyle).field_0.Flags & 4) >> 2));
  }
  pTVar21 = this->lightlist;
  if (pTVar21 == (TArray<lightlist_t,_lightlist_t> *)0x0) {
    uVar20 = 1;
  }
  else {
    uVar20 = pTVar21->Count;
  }
  fVar26 = this->topclip;
  fVar28 = this->bottomclip;
  bVar19 = fVar28 != -1e+19 ||
           (fVar26 != 1e+19 || pTVar21 != (TArray<lightlist_t,_lightlist_t> *)0x0);
  fVar27 = 1e+19;
  fVar29 = -1e+19;
  if ((fVar28 != -1e+19 || (fVar26 != 1e+19 || pTVar21 != (TArray<lightlist_t,_lightlist_t> *)0x0))
     && (fVar27 = fVar26, fVar29 = fVar28, ((byte)gl.flags & 0x20) == 0)) {
    gl_RenderState.mSplitEnabled = true;
    (*_ptrc_glEnable)(0x3003);
    (*_ptrc_glEnable)(0x3004);
    fVar27 = this->topclip;
    fVar29 = this->bottomclip;
  }
  local_58.normal.X = 0.0;
  local_58.normal.Y = 0.0;
  local_58.normal.Z = -1.0;
  local_58.D = (double)fVar29;
  local_58.negiC = 0.0;
  local_88.normal.X = 0.0;
  local_88.normal.Y = 0.0;
  local_88.normal.Z = -1.0;
  local_88.D = (double)fVar27;
  local_88.negiC = 0.0;
  if (uVar20 != 0) {
    local_90 = (ulong)uVar20;
    lVar25 = 0x50;
    uVar23 = 0;
    do {
      pTVar21 = this->lightlist;
      if (pTVar21 == (TArray<lightlist_t,_lightlist_t> *)0x0) {
        if (bVar19) {
          gl_RenderState.mSplitTopPlane.vec[0] = (float)local_88.normal.X;
          gl_RenderState.mSplitTopPlane.vec[1] = (float)local_88.normal.Y;
          gl_RenderState.mSplitTopPlane.vec[2] = (float)(1.0 / local_88.normal.Z);
          gl_RenderState.mSplitTopPlane.vec[3] = (float)local_88.D;
          gl_RenderState.mSplitBottomPlane.vec[0] = (float)local_58.normal.X;
          gl_RenderState.mSplitBottomPlane.vec[1] = (float)local_58.normal.Y;
          gl_RenderState.mSplitBottomPlane.vec[2] = (float)(1.0 / local_58.normal.Z);
          gl_RenderState.mSplitBottomPlane.vec[3] = (float)local_58.D;
        }
      }
      else {
        plVar9 = pTVar21->Array;
        psVar1 = (secplane_t *)((long)&plVar9[-1].plane.normal.X + lVar25);
        top = psVar1;
        if (uVar23 == 0) {
          top = &local_88;
        }
        bottom = (secplane_t *)((long)&(plVar9->plane).normal.X + lVar25);
        if (uVar23 == pTVar21->Count - 1) {
          bottom = &local_58;
        }
        if (psVar1[1].negiC == 0.0) {
          uVar20 = this->lightlevel;
        }
        else {
          uVar7 = **(ushort **)((long)plVar9 + lVar25 + -0x28);
          uVar20 = (uint)uVar7;
          if (0xfe < uVar7) {
            uVar20 = 0xff;
          }
          if ((short)uVar7 < 1) {
            uVar20 = 0;
          }
        }
        pAVar24 = this->actor;
        uVar22 = uVar20;
        if (pAVar24 != (AActor *)0x0) {
          local_c8 = (pAVar24->Prev).Z;
          local_c8 = ((pAVar24->__Pos).Z - local_c8) * r_TicFracF + local_c8;
          dVar14 = (pAVar24->Prev).X;
          dVar13 = (pAVar24->Prev).Y;
          dVar13 = r_TicFracF * ((pAVar24->__Pos).Y - dVar13) + dVar13;
          uStack_d0._0_4_ = (float)SUB84(dVar13,0);
          _local_d8 = r_TicFracF * ((pAVar24->__Pos).X - dVar14) + dVar14;
          uStack_d0._4_4_ = (int)((ulong)dVar13 >> 0x20);
          uVar22 = gl_CheckSpriteGlow(pAVar24->Sector,uVar20,(DVector3 *)local_d8);
          uVar22 = uVar22 & 0xff;
          pTVar21 = this->lightlist;
        }
        auStack_d4 = (undefined1  [4])(this->Colormap).FadeColor.field_0.d;
        plVar9 = pTVar21->Array;
        PVar8.field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             ((anon_union_4_2_12391d7c_for_PalEntry_0 *)
             (*(long *)((long)plVar9 + lVar25 + -0x20) + 8))->d;
        local_d8 = (undefined1  [4])PVar8.field_0;
        lVar10 = *(long *)((long)plVar9 + lVar25 + -0x20);
        auVar15[0xc] = *(undefined1 *)(lVar10 + 0xb);
        auVar15._0_4_ = local_d8;
        auVar15._4_4_ = auStack_d4;
        auVar15._8_4_ = *(float *)(lVar10 + 0x10);
        uStack_d0._5_3_ = 0;
        _local_d8 = auVar15;
        lVar11 = *(long *)((long)plVar9 + lVar25 + -8);
        if (((lVar11 != 0) && ((*(byte *)(lVar11 + 0x5b) & 8) != 0)) &&
           ((*(uint *)(lVar10 + 0xc) & 0xffffff) != 0)) {
          auStack_d4 = (undefined1  [4])*(uint *)(lVar10 + 0xc);
          local_d8 = (undefined1  [4])PVar8.field_0;
          uStack_d0._0_5_ = auVar15._8_5_;
          uStack_d0._5_3_ = 0;
        }
        FVar17 = _local_d8;
        if (glset.nocoloredspritelighting == true) {
          local_d8[1] = (undefined1)
                        ((((((uint)PVar8.field_0 & 0xff) +
                           ((uint)PVar8.field_0 >> 8 & 0xff) + ((uint)PVar8.field_0 >> 0x10 & 0xff))
                           * 0x5556 >> 0xf & 0xfffffffe) + 0xff) * 0x5556 >> 0x10);
          local_d8[0] = local_d8[1];
          stack0xffffffffffffff2b = FVar17._3_13_;
          local_d8[2] = local_d8[1];
        }
        gl_SetColor(uVar22,rellight,(FColormap *)local_d8,this->trans,false);
        if (!bVar18) {
          gl_SetFog(uVar20,rellight,(FColormap *)local_d8,isadditive);
        }
        FRenderState::SetSplitPlanes(&gl_RenderState,top,bottom);
      }
      if (this->modelframe == (FSpriteModelFrame *)0x0) {
        FRenderState::Apply(&gl_RenderState);
        if (((this->actor->renderflags).Value & 0x7000) != 0x2000) {
          CalculateVertices(this,(FVector3 *)local_d8);
        }
        iVar16 = gl.buffermethod;
        local_a0.p = FQuadDrawer::buffer;
        if (gl.buffermethod != 1) {
          pFVar12 = GLRenderer->mVBO;
          local_a0.ndx = pFVar12->mCurIndex;
          pFVar12->mCurIndex = local_a0.ndx + 4U;
          if (0x1e828b < local_a0.ndx + 4U) {
            pFVar12->mCurIndex = pFVar12->mIndex;
          }
          local_a0.p = pFVar12->map + (uint)local_a0.ndx;
        }
        aVar2 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->ul;
        aVar3 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->vt;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)local_a0.p = (uint32)local_d8.field_0;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 4))->d = (uint32)auStack_d4;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 8))->d =
             (uint32)(float)uStack_d0;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0xc) = aVar2;
        aVar4 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->ur;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x10) = aVar3;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x14))->d = uStack_d0._4_4_;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x18))->d =
             (uint32)SUB84(local_c8,0);
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x1c))->d =
             (uint32)(float)((ulong)local_c8 >> 0x20);
        aVar5 = (anon_union_4_2_12391d7c_for_PalEntry_0)this->vb;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x20) = aVar4;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x24) = aVar3;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x28))->d = (uint32)local_c0;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x2c))->d =
             (uint32)(float)((ulong)local_c0 >> 0x20);
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x30) = local_b8;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x34) = aVar2;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x38) = aVar5;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x3c))->d = (uint32)local_b4;
        ((anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x40))->d =
             (uint32)(float)((ulong)local_b4 >> 0x20);
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x44) = local_ac;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x48) = aVar4;
        *(anon_union_4_2_12391d7c_for_PalEntry_0 *)((long)local_a0.p + 0x4c) = aVar5;
        if (iVar16 == 1) {
          FQuadDrawer::DoRender(&local_a0,5);
        }
        else {
          (*_ptrc_glDrawArrays)(5,local_a0.ndx,4);
        }
        if (bVar18) {
          gl_SetFog((uint)this->foglevel,rellight,local_a8,isadditive);
          gl_RenderState.mColormapState = 0x10000000;
          if (gl_direct_state_change.Value == false) {
            gl_RenderState.mBlendEquation = 0x8006;
          }
          else {
            (*_ptrc_glBlendEquation)(0x8006);
          }
          if ((gl_direct_state_change.Value & 1U) == 0) {
            gl_RenderState.mSrcBlend = 0x302;
            gl_RenderState.mDstBlend = 0x303;
          }
          else {
            (*_ptrc_glBlendFunc)(0x302,0x303);
          }
          FRenderState::Apply(&gl_RenderState);
          if (gl.buffermethod == 1) {
            FQuadDrawer::DoRender(&local_a0,5);
          }
          else {
            (*_ptrc_glDrawArrays)(5,local_a0.ndx,4);
          }
          gl_RenderState.mColormapState = 0;
        }
      }
      else {
        gl_RenderModel(this);
      }
      uVar23 = uVar23 + 1;
      lVar25 = lVar25 + 0x50;
    } while (local_90 != uVar23);
  }
  if ((bVar19) && (((byte)gl.flags & 0x20) == 0)) {
    gl_RenderState.mSplitEnabled = false;
    (*_ptrc_glDisable)(0x3003);
    (*_ptrc_glDisable)(0x3004);
  }
  if (pass == 4) {
    gl_RenderState.mBrightmapEnabled = true;
    if (gl_direct_state_change.Value == false) {
      gl_RenderState.mSrcBlend = 0x302;
      gl_RenderState.mDstBlend = 0x303;
    }
    else {
      (*_ptrc_glBlendFunc)(0x302,0x303);
    }
    if ((gl_direct_state_change.Value & 1U) == 0) {
      gl_RenderState.mBlendEquation = 0x8006;
    }
    else {
      (*_ptrc_glBlendEquation)(0x8006);
    }
    gl_RenderState.mTextureMode = 0;
  }
  gl_RenderState.mDynColor.vec[2] = 0.0;
  gl_RenderState.mDynColor.vec[3] = 0.0;
  gl_RenderState.mDynColor.vec[0] = 0.0;
  gl_RenderState.mDynColor.vec[1] = 0.0;
  gl_RenderState.mObjectColor.field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0xffffffff;
  gl_RenderState.mTextureEnabled = true;
  return;
}

Assistant:

void GLSprite::Draw(int pass)
{
	if (pass == GLPASS_DECALS || pass == GLPASS_LIGHTSONLY) return;

	bool additivefog = false;
	bool foglayer = false;
	int rel = fullbright? 0 : getExtraLight();

	if (pass==GLPASS_TRANSLUCENT)
	{
		// The translucent pass requires special setup for the various modes.

		// for special render styles brightmaps would not look good - especially for subtractive.
		if (RenderStyle.BlendOp != STYLEOP_Add)
		{
			gl_RenderState.EnableBrightmap(false);
		}

		gl_SetRenderStyle(RenderStyle, false, 
			// The rest of the needed checks are done inside gl_SetRenderStyle
			trans > 1.f - FLT_EPSILON && gl_usecolorblending && gl_fixedcolormap == CM_DEFAULT && actor && 
			fullbright && gltexture && !gltexture->GetTransparent());

		if (hw_styleflags == STYLEHW_NoAlphaTest)
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, 0.f);
		}
		else
		{
			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
		}

		if (RenderStyle.BlendOp == STYLEOP_Shadow)
		{
			float fuzzalpha=0.44f;
			float minalpha=0.1f;

			// fog + fuzz don't work well without some fiddling with the alpha value!
			if (!gl_isBlack(Colormap.FadeColor))
			{
				float dist=Dist2(ViewPos.X, ViewPos.Y, x,y);

				if (!Colormap.FadeColor.a) Colormap.FadeColor.a=clamp<int>(255-lightlevel,60,255);

				// this value was determined by trial and error and is scale dependent!
				float factor=0.05f+exp(-Colormap.FadeColor.a*dist/62500.f);
				fuzzalpha*=factor;
				minalpha*=factor;
			}

			gl_RenderState.AlphaFunc(GL_GEQUAL, gl_mask_sprite_threshold);
			gl_RenderState.SetColor(0.2f,0.2f,0.2f,fuzzalpha, Colormap.desaturation);
			additivefog = true;
		}
		else if (RenderStyle.BlendOp == STYLEOP_Add && RenderStyle.DestAlpha == STYLEALPHA_One)
		{
			additivefog = true;
		}
	}
	if (RenderStyle.BlendOp!=STYLEOP_Shadow)
	{
		if (gl_lights && GLRenderer->mLightCount && !gl_fixedcolormap && !fullbright)
		{
			gl_SetDynSpriteLight(gl_light_sprites ? actor : NULL, gl_light_particles ? particle : NULL);
		}
		gl_SetColor(lightlevel, rel, Colormap, trans);
	}
	gl_RenderState.SetObjectColor(ThingColor);

	if (gl_isBlack(Colormap.FadeColor)) foglevel=lightlevel;

	if (RenderStyle.Flags & STYLEF_FadeToBlack) 
	{
		Colormap.FadeColor=0;
		additivefog = true;
	}

	if (RenderStyle.BlendOp == STYLEOP_RevSub || RenderStyle.BlendOp == STYLEOP_Sub)
	{
		if (!modelframe)
		{
			// non-black fog with subtractive style needs special treatment
			if (!gl_isBlack(Colormap.FadeColor))
			{
				foglayer = true;
				// Due to the two-layer approach we need to force an alpha test that lets everything pass
				gl_RenderState.AlphaFunc(GL_GREATER, 0);
			}
		}
		else RenderStyle.BlendOp = STYLEOP_Fuzz;	// subtractive with models is not going to work.
	}

	if (!foglayer) gl_SetFog(foglevel, rel, &Colormap, additivefog);
	else
	{
		gl_RenderState.EnableFog(false);
		gl_RenderState.SetFog(0, 0);
	}

	if (gltexture) gl_RenderState.SetMaterial(gltexture, CLAMP_XY, translation, OverrideShader, !!(RenderStyle.Flags & STYLEF_RedIsAlpha));
	else if (!modelframe) gl_RenderState.EnableTexture(false);

		//gl_SetColor(lightlevel, rel, Colormap, trans);

	unsigned int iter = lightlist? lightlist->Size() : 1;
	bool clipping = false;
	if (lightlist || topclip != LARGE_VALUE || bottomclip != -LARGE_VALUE)
	{
		clipping = true;
		gl_RenderState.EnableSplit(true);
	}

	secplane_t bottomp = { { 0, 0, -1. }, bottomclip };
	secplane_t topp = { { 0, 0, -1. }, topclip };
	for (unsigned i = 0; i < iter; i++)
	{
		if (lightlist)
		{
			// set up the light slice
			secplane_t *topplane = i == 0 ? &topp : &(*lightlist)[i].plane;
			secplane_t *lowplane = i == (*lightlist).Size() - 1 ? &bottomp : &(*lightlist)[i + 1].plane;

			int thislight = (*lightlist)[i].caster != NULL ? gl_ClampLight(*(*lightlist)[i].p_lightlevel) : lightlevel;
			int thisll = actor == nullptr? thislight : (uint8_t)gl_CheckSpriteGlow(actor->Sector, thislight, actor->InterpolatedPosition(r_TicFracF));

			FColormap thiscm;
			thiscm.FadeColor = Colormap.FadeColor;
			thiscm.CopyFrom3DLight(&(*lightlist)[i]);
			if (glset.nocoloredspritelighting)
			{
				thiscm.Decolorize();
			}

			gl_SetColor(thisll, rel, thiscm, trans);
			if (!foglayer)
			{
				gl_SetFog(thislight, rel, &thiscm, additivefog);
			}
			gl_RenderState.SetSplitPlanes(*topplane, *lowplane);
		}
		else if (clipping)
		{
			gl_RenderState.SetSplitPlanes(topp, bottomp);
		}

		if (!modelframe)
		{
			gl_RenderState.Apply();

			FVector3 v[4];
			if ((actor->renderflags & RF_SPRITETYPEMASK) == RF_FLATSPRITE)
			{
			}
			else
			{
				CalculateVertices(v);
			}


			FQuadDrawer qd;
			qd.Set(0, v[0][0], v[0][1], v[0][2], ul, vt);
			qd.Set(1, v[1][0], v[1][1], v[1][2], ur, vt);
			qd.Set(2, v[2][0], v[2][1], v[2][2], ul, vb);
			qd.Set(3, v[3][0], v[3][1], v[3][2], ur, vb);
			qd.Render(GL_TRIANGLE_STRIP);

			if (foglayer)
			{
				// If we get here we know that we have colored fog and no fixed colormap.
				gl_SetFog(foglevel, rel, &Colormap, additivefog);
				gl_RenderState.SetFixedColormap(CM_FOGLAYER);
				gl_RenderState.BlendEquation(GL_FUNC_ADD);
				gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
				gl_RenderState.Apply();
				qd.Render(GL_TRIANGLE_STRIP);
				gl_RenderState.SetFixedColormap(CM_DEFAULT);
			}
		}
		else
		{
			gl_RenderModel(this);
		}
	}

	if (clipping)
	{
		gl_RenderState.EnableSplit(false);
	}

	if (pass==GLPASS_TRANSLUCENT)
	{
		gl_RenderState.EnableBrightmap(true);
		gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
		gl_RenderState.BlendEquation(GL_FUNC_ADD);
		gl_RenderState.SetTextureMode(TM_MODULATE);
	}

	gl_RenderState.SetObjectColor(0xffffffff);
	gl_RenderState.EnableTexture(true);
	gl_RenderState.SetDynLight(0,0,0);
}